

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void __thiscall chatra::Thread::processSwitchCase(Thread *this,bool enter)

{
  pointer pFVar1;
  ulong uVar2;
  pointer psVar3;
  pointer psVar4;
  Node *pNVar5;
  pointer psVar6;
  undefined7 in_register_00000031;
  pointer psVar7;
  long lVar8;
  
  if ((int)CONCAT71(in_register_00000031,enter) == 0) {
    pop(this);
    return;
  }
  pFVar1 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pNVar5 = pFVar1[-1].node;
  while ((pNVar5->blockNodes).
         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (pNVar5->blockNodes).
         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    uVar2 = pFVar1[-2].phase;
    psVar3 = ((pFVar1[-2].node)->blockNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)((pFVar1[-2].node)->blockNodes).
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <= uVar2)
    break;
    checkIsValidNode(this,psVar3[uVar2].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
    pNVar5 = psVar3[uVar2].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (1 < (byte)(pNVar5->type - Case)) break;
    pFVar1[-1].node = pNVar5;
    pFVar1[-2].phase = pFVar1[-2].phase + 1;
  }
  pFVar1[-1].phase = 0;
  psVar3 = ((pFVar1[-2].node)->blockNodes).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = ((pFVar1[-2].node)->blockNodes).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)psVar4 - (long)psVar3 >> 6;
  psVar6 = psVar3;
  if (0 < lVar8) {
    psVar6 = (pointer)((long)&(psVar3->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)
                              ._M_ptr + ((long)psVar4 - (long)psVar3 & 0xffffffffffffffc0U));
    lVar8 = lVar8 + 1;
    psVar7 = psVar3 + 2;
    do {
      if (((psVar7[-2].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
          ~ScriptRoot) == Catch) {
        psVar7 = psVar7 + -2;
        goto LAB_0016bf11;
      }
      if (((psVar7[-1].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
          ~ScriptRoot) == Catch) {
        psVar7 = psVar7 + -1;
        goto LAB_0016bf11;
      }
      if ((((psVar7->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
          ~ScriptRoot) == Catch) goto LAB_0016bf11;
      if (((psVar7[1].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
          ~ScriptRoot) == Catch) {
        psVar7 = psVar7 + 1;
        goto LAB_0016bf11;
      }
      lVar8 = lVar8 + -1;
      psVar7 = psVar7 + 4;
    } while (1 < lVar8);
  }
  lVar8 = (long)psVar4 - (long)psVar6 >> 4;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      psVar7 = psVar4;
      if ((lVar8 != 3) ||
         (psVar7 = psVar6,
         (((psVar6->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
         ~ScriptRoot) == Catch)) goto LAB_0016bf11;
      psVar6 = psVar6 + 1;
    }
    psVar7 = psVar6;
    if ((((psVar6->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
        ~ScriptRoot) == Catch) goto LAB_0016bf11;
    psVar6 = psVar6 + 1;
  }
  psVar7 = psVar4;
  if ((((psVar6->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
      ~ScriptRoot) == Catch) {
    psVar7 = psVar6;
  }
LAB_0016bf11:
  pFVar1[-2].phase = (long)psVar7 - (long)psVar3 >> 4;
  return;
}

Assistant:

void Thread::processSwitchCase(bool enter) {
	if (!enter) {
		pop();
		return;
	}

	auto& f0 = *(frames.end() - 1);
	auto& f1 = *(frames.end() - 2);

	while (f0.node->blockNodes.empty() && f1.phase < f1.node->blockNodes.size()) {
		auto& nextNode = f1.node->blockNodes[f1.phase];
		checkIsValidNode(nextNode.get());
		if (nextNode->type != NodeType::Case && nextNode->type != NodeType::Default)
			break;
		f0.node = nextNode.get();
		f1.phase++;
	}

	f0.phase = 0;
	f1.phase = static_cast<size_t>(std::distance(f1.node->blockNodes.cbegin(),
			std::find_if(f1.node->blockNodes.cbegin(), f1.node->blockNodes.cend(), [](const std::shared_ptr<Node>& n) {
				return n->type == NodeType::Catch || n->type == NodeType::Finally;
			})));
}